

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::checkfac4split(tetgenmesh *this,face *chkfac,point *encpt,int *qflag,double *cent)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  point pdVar7;
  point pdVar8;
  point pdVar9;
  double local_168;
  double smlen;
  triface searchtet;
  int t1ver;
  double volbnd;
  triface adjtet;
  int local_128;
  int i;
  int indx [4];
  double local_110;
  double D;
  double rhs [4];
  double A [4] [4];
  double len;
  double rd;
  double area;
  point pc;
  point pb;
  point pa;
  double *cent_local;
  int *qflag_local;
  point *encpt_local;
  face *chkfac_local;
  tetgenmesh *this_local;
  
  *encpt = (point)0x0;
  *qflag = 0;
  pdVar7 = sorg(this,chkfac);
  pdVar8 = sdest(this,chkfac);
  pdVar9 = sapex(this,chkfac);
  rhs[3] = *pdVar8 - *pdVar7;
  A[0][0] = pdVar8[1] - pdVar7[1];
  A[0][1] = pdVar8[2] - pdVar7[2];
  A[0][3] = *pdVar9 - *pdVar7;
  A[1][0] = pdVar9[1] - pdVar7[1];
  A[1][1] = pdVar9[2] - pdVar7[2];
  cross(this,rhs + 3,A[0] + 3,A[1] + 3);
  dVar2 = dot(this,A[1] + 3,A[1] + 3);
  dVar2 = sqrt(dVar2);
  dVar2 = dVar2 * 0.5;
  dVar3 = dot(this,rhs + 3,rhs + 3);
  D = dVar3 * 0.5;
  dVar3 = dot(this,A[0] + 3,A[0] + 3);
  rhs[0] = dVar3 * 0.5;
  rhs[1] = 0.0;
  bVar6 = lu_decmp(this,(double (*) [4])(rhs + 3),3,&local_128,&local_110,0);
  if (!bVar6) {
    terminatetetgen(this,2);
  }
  lu_solve(this,(double (*) [4])(rhs + 3),3,&local_128,&D,0);
  *cent = *pdVar7 + D;
  cent[1] = pdVar7[1] + rhs[0];
  cent[2] = pdVar7[2] + rhs[1];
  dVar3 = sqrt(rhs[1] * rhs[1] + D * D + rhs[0] * rhs[0]);
  if (((this->checkconstraints == 0) || (dVar4 = areabound(this,chkfac), dVar4 <= 0.0)) ||
     (dVar4 = areabound(this,chkfac), dVar2 <= dVar4)) {
    if ((this->b->fixedvolume == 0) ||
       (dVar4 = sqrt(dVar2), pdVar1 = &this->b->maxvolume,
       dVar2 * dVar4 < *pdVar1 || dVar2 * dVar4 == *pdVar1)) {
      if (this->b->varvolume != 0) {
        triface::triface((triface *)&volbnd);
        stpivot(this,chkfac,(triface *)&volbnd);
        bVar6 = ishulltet(this,(triface *)&volbnd);
        if (((!bVar6) && (dVar4 = volumebound(this,(tetrahedron *)volbnd), 0.0 < dVar4)) &&
           (dVar5 = sqrt(dVar2), dVar4 < dVar2 * dVar5)) {
          *qflag = 1;
          return 1;
        }
        searchtet._12_4_ = (uint)adjtet.tet;
        decode(this,*(tetrahedron *)((long)volbnd + (long)(int)((uint)adjtet.tet & 3) * 8),
               (triface *)&volbnd);
        adjtet.tet._0_4_ = fsymtbl[(int)searchtet._12_4_][(int)(uint)adjtet.tet];
        bVar6 = ishulltet(this,(triface *)&volbnd);
        if (((!bVar6) && (dVar4 = volumebound(this,(tetrahedron *)volbnd), 0.0 < dVar4)) &&
           (dVar5 = sqrt(dVar2), dVar4 < dVar2 * dVar5)) {
          *qflag = 1;
          return 1;
        }
      }
      if ((this->b->metric == 0) ||
         (((pdVar7[this->pointmtrindex] <= 0.0 ||
           (dVar3 < pdVar7[this->pointmtrindex] || dVar3 == pdVar7[this->pointmtrindex])) &&
          (((pdVar8[this->pointmtrindex] <= 0.0 ||
            (dVar3 < pdVar8[this->pointmtrindex] || dVar3 == pdVar8[this->pointmtrindex])) &&
           ((pdVar9[this->pointmtrindex] <= 0.0 ||
            (dVar3 < pdVar9[this->pointmtrindex] || dVar3 == pdVar9[this->pointmtrindex])))))))) {
        triface::triface((triface *)&smlen);
        local_168 = 0.0;
        for (adjtet._12_4_ = 0; (int)adjtet._12_4_ < 2; adjtet._12_4_ = adjtet._12_4_ + 1) {
          stpivot(this,chkfac,(triface *)&smlen);
          bVar6 = ishulltet(this,(triface *)&smlen);
          if (!bVar6) {
            pdVar7 = oppo(this,(triface *)&smlen);
            A[3][3] = distance(this,pdVar7,cent);
            if (ABS(A[3][3] - dVar3) / dVar3 < this->b->epsilon) {
              A[3][3] = dVar3;
            }
            if (A[3][3] < dVar3) {
              if ((local_168 != 0.0) || (NAN(local_168))) {
                if (A[3][3] < local_168) {
                  local_168 = A[3][3];
                  pdVar7 = oppo(this,(triface *)&smlen);
                  *encpt = pdVar7;
                }
              }
              else {
                local_168 = A[3][3];
                pdVar7 = oppo(this,(triface *)&smlen);
                *encpt = pdVar7;
              }
            }
          }
          sesymself(this,chkfac);
        }
        this_local._4_4_ = (uint)(*encpt != (point)0x0);
      }
      else {
        *qflag = 1;
        this_local._4_4_ = 1;
      }
    }
    else {
      *qflag = 1;
      this_local._4_4_ = 1;
    }
  }
  else {
    *qflag = 1;
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int tetgenmesh::checkfac4split(face *chkfac, point& encpt, int& qflag, 
                               REAL *cent)
{
  point pa, pb, pc;
  REAL area, rd, len;
  REAL A[4][4], rhs[4], D;
  int indx[4];
  int i;

  encpt = NULL;
  qflag = 0;

  pa = sorg(*chkfac);
  pb = sdest(*chkfac);
  pc = sapex(*chkfac);

  // Compute the coefficient matrix A (3x3).
  A[0][0] = pb[0] - pa[0];
  A[0][1] = pb[1] - pa[1];
  A[0][2] = pb[2] - pa[2]; // vector V1 (pa->pb)
  A[1][0] = pc[0] - pa[0];
  A[1][1] = pc[1] - pa[1];
  A[1][2] = pc[2] - pa[2]; // vector V2 (pa->pc)
  cross(A[0], A[1], A[2]); // vector V3 (V1 X V2)

  area = 0.5 * sqrt(dot(A[2], A[2])); // The area of [a,b,c].

  // Compute the right hand side vector b (3x1).
  rhs[0] = 0.5 * dot(A[0], A[0]); // edge [a,b]
  rhs[1] = 0.5 * dot(A[1], A[1]); // edge [a,c]
  rhs[2] = 0.0;

  // Solve the 3 by 3 equations use LU decomposition with partial 
  //   pivoting and backward and forward substitute.
  if (!lu_decmp(A, 3, indx, &D, 0)) {
    // A degenerate triangle. 
    terminatetetgen(this, 2);
  }

  lu_solve(A, 3, indx, rhs, 0);
  cent[0] = pa[0] + rhs[0];
  cent[1] = pa[1] + rhs[1];
  cent[2] = pa[2] + rhs[2];
  rd = sqrt(rhs[0] * rhs[0] + rhs[1] * rhs[1] + rhs[2] * rhs[2]);

  if (checkconstraints && (areabound(*chkfac) > 0.0)) {
    // Check if the subface has too big area.
    if (area > areabound(*chkfac)) {
      qflag = 1;
      return 1;
    }
  }

  if (b->fixedvolume) {
    if ((area * sqrt(area)) > b->maxvolume) {
      qflag = 1;
      return 1;
    }
  }

  if (b->varvolume) {
    triface adjtet;
    REAL volbnd;
    int t1ver;

    stpivot(*chkfac, adjtet);
    if (!ishulltet(adjtet)) {
      volbnd = volumebound(adjtet.tet);
      if ((volbnd > 0) && (area * sqrt(area)) > volbnd) {
        qflag = 1;
        return 1;
      }
    }
    fsymself(adjtet);
    if (!ishulltet(adjtet)) {
      volbnd = volumebound(adjtet.tet);
      if ((volbnd > 0) && (area * sqrt(area)) > volbnd) {
        qflag = 1;
        return 1;
      }
    }
  }

  if (b->metric) { // -m option. Check mesh size. 
    // Check if the ccent lies outside one of the prot.balls at vertices.
    if (((pa[pointmtrindex] > 0) && (rd > pa[pointmtrindex])) ||
        ((pb[pointmtrindex] > 0) && (rd > pb[pointmtrindex])) ||
        ((pc[pointmtrindex] > 0) && (rd > pc[pointmtrindex]))) {
      qflag = 1; // Enforce mesh size.
      return 1;
    }
  }

  triface searchtet;
  REAL smlen = 0;

  // Check if this subface is locally encroached.
  for (i = 0; i < 2; i++) {
    stpivot(*chkfac, searchtet);
    if (!ishulltet(searchtet)) {
      len = distance(oppo(searchtet), cent);
      if ((fabs(len - rd) / rd) < b->epsilon) len = rd;// Rounding.
      if (len < rd) {
        if (smlen == 0) {
          smlen = len;
          encpt = oppo(searchtet);
        } else {
          if (len < smlen) {
            smlen = len;
            encpt = oppo(searchtet);
          }
        }
        //return 1;
      }
    }
    sesymself(*chkfac);
  }

  return encpt != NULL; //return 0;
}